

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_functional.h
# Opt level: O2

Context __thiscall
mp::QuadraticFunctionalConstraint::
AddQuadraticConstraint<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
          (QuadraticFunctionalConstraint *this,
          FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          *cvt)

{
  CtxVal CVar1;
  Error *this_00;
  QuadTerms *this_01;
  QuadAndLinTerms *le_00;
  LinTerms *this_02;
  LinTerms le;
  QuadTerms qt;
  LinTerms local_1018;
  LinTerms local_fa0;
  LinTerms local_f28;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_> local_eb0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_> local_cd0;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_> local_af0;
  QuadAndLinTerms local_910;
  QuadAndLinTerms local_758;
  QuadAndLinTerms local_5a0;
  QuadTerms local_3e8;
  QuadTerms local_2a8;
  QuadTerms local_168;
  
  LinTerms::LinTerms(&le,(LinTerms *)&this->quad_expr_);
  LinTerms::add_term(&le,-1.0,(this->super_FunctionalConstraint).result_var_);
  QuadTerms::QuadTerms(&qt,&(this->quad_expr_).super_QuadAndLinTerms.super_QuadTerms);
  CVar1 = (this->super_FunctionalConstraint).ctx.value_;
  if (CVar1 - CTX_ROOT < 2) {
    this_02 = &local_fa0;
    LinTerms::LinTerms(this_02,&le);
    this_01 = &local_2a8;
    QuadTerms::QuadTerms(this_01,&qt);
    QuadAndLinTerms::QuadAndLinTerms(&local_758,this_02,this_01);
    le_00 = &local_758;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::AlgebraicConstraint
              (&local_cd0,le_00,
               (AlgConRhs<1>)((this->quad_expr_).constant_term_ ^ 0x8000000000000000),true);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<1>>>
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                *)cvt,&local_cd0);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<1>_>::~AlgebraicConstraint(&local_cd0);
  }
  else if (CVar1 == CTX_MIX) {
    this_02 = &local_f28;
    LinTerms::LinTerms(this_02,&le);
    this_01 = &local_168;
    QuadTerms::QuadTerms(this_01,&qt);
    QuadAndLinTerms::QuadAndLinTerms(&local_5a0,this_02,this_01);
    le_00 = &local_5a0;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::AlgebraicConstraint
              (&local_af0,le_00,
               (AlgConRhs<0>)((this->quad_expr_).constant_term_ ^ 0x8000000000000000),true);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<0>>>
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                *)cvt,&local_af0);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<0>_>::~AlgebraicConstraint(&local_af0);
  }
  else {
    if (1 < CVar1 - CTX_NEG) {
      this_00 = (Error *)__cxa_allocate_exception(0x18);
      Error::Error(this_00,(CStringRef)0x368058,-1);
      __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    this_02 = &local_1018;
    LinTerms::LinTerms(this_02,&le);
    this_01 = &local_3e8;
    QuadTerms::QuadTerms(this_01,&qt);
    QuadAndLinTerms::QuadAndLinTerms(&local_910,this_02,this_01);
    le_00 = &local_910;
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::AlgebraicConstraint
              (&local_eb0,le_00,
               (AlgConRhs<_1>)((this->quad_expr_).constant_term_ ^ 0x8000000000000000),true);
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
    ::AddConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
              ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
                *)cvt,&local_eb0);
    AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::~AlgebraicConstraint(&local_eb0);
  }
  QuadAndLinTerms::~QuadAndLinTerms(le_00);
  QuadTerms::~QuadTerms(this_01);
  LinTerms::~LinTerms(this_02);
  CVar1 = (this->super_FunctionalConstraint).ctx.value_;
  QuadTerms::~QuadTerms(&qt);
  LinTerms::~LinTerms(&le);
  return (Context)CVar1;
}

Assistant:

Context AddQuadraticConstraint(Converter& cvt) const {
    auto le = GetQuadExpr().GetLinTerms();
    le.add_term(-1.0, FunctionalConstraint::GetResultVar());
    auto qt = GetQuadExpr().GetQPTerms();
    if (GetContext().IsMixed())
      cvt.AddConstraint( QuadConEQ{ { std::move(le), std::move(qt) },
      -GetQuadExpr().constant_term() } );
    else if (GetContext().HasPositive())
      cvt.AddConstraint( QuadConGE{ { std::move(le), std::move(qt) },
      -GetQuadExpr().constant_term() } );
    else if (GetContext().HasNegative())
      cvt.AddConstraint( QuadConLE{ { std::move(le), std::move(qt) },
      -GetQuadExpr().constant_term() } );
    else
      MP_RAISE("QuadraticFuncCon: no context");
    return GetContext();
  }